

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void clear_padding_bits(uint8_t *v,uint diff)

{
  uint diff_local;
  uint8_t *v_local;
  
  *v = *v & (byte)(0xff << ((byte)diff & 0x1f));
  return;
}

Assistant:

static inline void clear_padding_bits(uint8_t* v, const unsigned int diff) {
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_255_255_4)
  *v &= UINT8_C(0xff) << diff;
#else
  (void)v;
  (void)diff;
#endif
}